

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__resample_row_h_2(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  stbi_uc sVar1;
  int iVar2;
  int n;
  stbi_uc *input;
  int i;
  int hs_local;
  int w_local;
  stbi_uc *in_far_local;
  stbi_uc *in_near_local;
  stbi_uc *out_local;
  
  if (w == 1) {
    sVar1 = *in_near;
    out[1] = sVar1;
    *out = sVar1;
  }
  else {
    *out = *in_near;
    out[1] = (stbi_uc)((int)((uint)*in_near * 3 + (uint)in_near[1] + 2) >> 2);
    for (input._4_4_ = 1; input._4_4_ < w + -1; input._4_4_ = input._4_4_ + 1) {
      iVar2 = (uint)in_near[input._4_4_] * 3 + 2;
      out[input._4_4_ << 1] = (stbi_uc)((int)(iVar2 + (uint)in_near[input._4_4_ + -1]) >> 2);
      out[input._4_4_ * 2 + 1] = (stbi_uc)((int)(iVar2 + (uint)in_near[input._4_4_ + 1]) >> 2);
    }
    out[input._4_4_ << 1] =
         (stbi_uc)((int)((uint)in_near[w + -2] * 3 + (uint)in_near[w + -1] + 2) >> 2);
    out[input._4_4_ * 2 + 1] = in_near[w + -1];
  }
  return out;
}

Assistant:

static stbi_uc*  stbi__resample_row_h_2(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate two samples horizontally for every one in input
   int i;
   stbi_uc *input = in_near;

   if (w == 1) {
      // if only one sample, can't do any interpolation
      out[0] = out[1] = input[0];
      return out;
   }

   out[0] = input[0];
   out[1] = stbi__div4(input[0]*3 + input[1] + 2);
   for (i=1; i < w-1; ++i) {
      int n = 3*input[i]+2;
      out[i*2+0] = stbi__div4(n+input[i-1]);
      out[i*2+1] = stbi__div4(n+input[i+1]);
   }
   out[i*2+0] = stbi__div4(input[w-2]*3 + input[w-1] + 2);
   out[i*2+1] = input[w-1];

   STBI_NOTUSED(in_far);
   STBI_NOTUSED(hs);

   return out;
}